

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O3

Point3f __thiscall pbrt::Interaction::OffsetRayOrigin(Interaction *this,Vector3f *w)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  ulong uVar6;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  float *pfVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Point3f PVar27;
  float local_c;
  undefined8 local_8;
  
  fVar2 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  fVar22 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high
  ;
  uVar11._0_4_ = (this->n).super_Tuple3<pbrt::Normal3,_float>.x;
  uVar11._4_4_ = (this->n).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar11;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  fVar15 = (this->n).super_Tuple3<pbrt::Normal3,_float>.z;
  fVar13 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar5 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar7 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar17._4_4_ = uVar7;
  auVar17._0_4_ = uVar5;
  auVar17._8_8_ = 0;
  fVar3 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  fVar4 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar20 = vmovshdup_avx(auVar25);
  auVar19 = vandps_avx(auVar25,auVar23);
  auVar16 = vandps_avx(auVar20,auVar23);
  auVar23 = vandps_avx(ZEXT416((uint)fVar15),auVar23);
  fVar8 = (fVar22 - fVar2) * 0.5;
  auVar24 = ZEXT416((uint)(fVar15 * fVar13));
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)fVar15),auVar24);
  auVar26 = ZEXT416((uint)(fVar8 * auVar23._0_4_));
  auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar8),auVar23,auVar26);
  auVar23 = vmovshdup_avx(auVar17);
  auVar23 = vfmadd213ss_fma(auVar23,auVar20,auVar24);
  uVar6 = *(ulong *)&(this->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar6;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar18._0_4_)),auVar25,auVar17);
  auVar18 = ZEXT816(0) << 0x20;
  uVar9 = vcmpss_avx512f(auVar20,auVar18,1);
  bVar10 = (bool)((byte)uVar9 & 1);
  auVar23 = vmovshdup_avx(auVar24);
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)((fVar3 - auVar23._0_4_) * 0.5)),auVar16,auVar26);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + auVar16._0_4_)),auVar19,
                            ZEXT416((uint)(((float)uVar6 - fVar4) * 0.5)));
  fVar13 = auVar19._0_4_;
  auVar19._0_4_ = (float)(undefined4)uVar11 * fVar13;
  auVar19._4_4_ = (float)uVar11._4_4_ * fVar13;
  auVar19._8_4_ = fVar13 * 0.0;
  auVar19._12_4_ = fVar13 * 0.0;
  fVar15 = (float)((uint)bVar10 * (int)-(fVar15 * fVar13) + (uint)!bVar10 * (int)(fVar15 * fVar13));
  if (auVar20._0_4_ < 0.0) {
    uVar11 = CONCAT44(auVar19._4_4_,auVar19._0_4_);
    auVar19._0_8_ = uVar11 ^ 0x8000000080000000;
    auVar19._8_4_ = -auVar19._8_4_;
    auVar19._12_4_ = -auVar19._12_4_;
  }
  auVar16 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar3),0x10);
  pfVar1 = (float *)((long)&local_8 + 4);
  iVar12 = 0;
  auVar20._0_4_ = (float)uVar6 + auVar16._0_4_;
  auVar20._4_4_ = (float)(uVar6 >> 0x20) + auVar16._4_4_;
  auVar20._8_4_ = auVar16._8_4_ + 0.0;
  auVar20._12_4_ = auVar16._12_4_ + 0.0;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar16 = vmulps_avx512vl(auVar20,auVar16);
  local_c = (fVar2 + fVar22) * 0.5 + fVar15;
  fVar2 = auVar19._0_4_;
  auVar21._0_4_ = auVar16._0_4_ + fVar2;
  auVar21._4_4_ = auVar16._4_4_ + auVar19._4_4_;
  auVar21._8_4_ = auVar16._8_4_ + auVar19._8_4_;
  auVar21._12_4_ = auVar16._12_4_ + auVar19._12_4_;
  local_8 = vmovlps_avx(auVar21);
  auVar19 = vmovshdup_avx(auVar19);
  do {
    fVar22 = fVar2;
    if ((iVar12 != 0) && (fVar22 = auVar19._0_4_, iVar12 != 1)) {
      fVar22 = fVar15;
    }
    if (fVar22 <= 0.0) {
      fVar22 = fVar2;
      if ((iVar12 != 0) && (fVar22 = auVar19._0_4_, iVar12 != 1)) {
        fVar22 = fVar15;
      }
      if (fVar22 < 0.0) {
        pfVar14 = (float *)&local_8;
        if ((iVar12 != 0) && (pfVar14 = pfVar1, iVar12 != 1)) {
          pfVar14 = &local_c;
        }
        fVar22 = *pfVar14;
        fVar13 = -INFINITY;
        if (-INFINITY < fVar22) {
          uVar9 = vcmpss_avx512f(ZEXT416((uint)fVar22),auVar18,0);
          bVar10 = (bool)((byte)uVar9 & 1);
          fVar22 = (float)((uint)bVar10 * -0x80000000 + (uint)!bVar10 * (int)fVar22);
          fVar13 = (float)((int)fVar22 + -1 + (uint)(fVar22 <= 0.0) * 2);
        }
        goto LAB_00274ec0;
      }
    }
    else {
      pfVar14 = (float *)&local_8;
      if ((iVar12 != 0) && (pfVar14 = pfVar1, iVar12 != 1)) {
        pfVar14 = &local_c;
      }
      fVar22 = *pfVar14;
      fVar13 = INFINITY;
      if (fVar22 < INFINITY) {
        uVar9 = vcmpss_avx512f(ZEXT416((uint)fVar22),auVar18,0);
        fVar22 = (float)((uint)!(bool)((byte)uVar9 & 1) * (int)fVar22);
        fVar13 = (float)((-(uint)(fVar22 < 0.0) | 1) + (int)fVar22);
      }
LAB_00274ec0:
      pfVar14 = (float *)&local_8;
      if ((iVar12 != 0) && (pfVar14 = pfVar1, iVar12 != 1)) {
        pfVar14 = &local_c;
      }
      *pfVar14 = fVar13;
    }
    iVar12 = iVar12 + 1;
    if (iVar12 == 3) {
      PVar27.super_Tuple3<pbrt::Point3,_float>.z = local_c;
      PVar27.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_8;
      PVar27.super_Tuple3<pbrt::Point3,_float>.y = (float)local_8._4_4_;
      return (Point3f)PVar27.super_Tuple3<pbrt::Point3,_float>;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    Point3f OffsetRayOrigin(const Vector3f &w) const {
        return pbrt::OffsetRayOrigin(pi, n, w);
    }